

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_sync(void)

{
  Integer grp_id;
  
  if (GA_Default_Proc_Group == -1) {
    ARMCI_AllFence();
    pnga_msg_sync();
    if (GA_fence_set != 0) {
      memset(fence_array,0,(long)(int)GAnproc);
    }
    GA_fence_set = 0;
  }
  else {
    pnga_pgroup_sync(grp_id);
  }
  return;
}

Assistant:

void pnga_sync()
{
  GA_Internal_Threadsafe_Lock();
#ifdef CHECK_MA
  Integer status;
#endif

#ifdef USE_ARMCI_GROUP_FENCE
  if (GA_Default_Proc_Group == -1) {
    int grp_id = (int)GA_Default_Proc_Group;
    ARMCI_GroupFence(&grp_id);
    pnga_msg_sync();
  } else {
    int grp_id = (Integer)GA_Default_Proc_Group;
    pnga_pgroup_sync(grp_id);
  }
#else
  if (GA_Default_Proc_Group == -1) {
    ARMCI_AllFence();
    pnga_msg_sync();
    if(GA_fence_set)bzero(fence_array,(int)GAnproc);
    GA_fence_set=0;
  } else {
    Integer grp_id = (Integer)GA_Default_Proc_Group;
    pnga_pgroup_sync(grp_id);
  }
#endif
#ifdef CHECK_MA
  status = MA_verify_allocator_stuff();
#endif
  GA_Internal_Threadsafe_Unlock();
}